

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

void __thiscall cfd::core::Psbt::Psbt(Psbt *this,ByteData *byte_data)

{
  int iVar1;
  string *message;
  undefined8 uVar2;
  Transaction *in_stack_fffffffffffffec0;
  string *in_stack_fffffffffffffed0;
  undefined8 in_stack_fffffffffffffed8;
  allocator *paVar3;
  CfdError error_code;
  undefined4 in_stack_fffffffffffffee0;
  Transaction local_100;
  undefined1 local_ba;
  allocator local_b9;
  string local_b8 [32];
  CfdSourceLocation local_98;
  undefined1 local_7a;
  allocator local_79;
  string local_78 [32];
  CfdSourceLocation local_58;
  int local_3c;
  size_t sStack_38;
  int ret;
  size_t is_elements;
  wally_psbt *local_20;
  wally_psbt *psbt_pointer;
  ByteData *byte_data_local;
  Psbt *this_local;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffed8 >> 0x20);
  this->_vptr_Psbt = (_func_int **)&PTR__Psbt_009f72a0;
  psbt_pointer = (wally_psbt *)byte_data;
  byte_data_local = (ByteData *)this;
  Transaction::Transaction(&this->base_tx_);
  local_20 = ParsePsbtData((ByteData *)psbt_pointer);
  sStack_38 = 0;
  iVar1 = wally_psbt_is_elements(local_20,&stack0xffffffffffffffc8);
  local_3c = iVar1;
  if (iVar1 != 0) {
    wally_psbt_free(local_20);
    local_58.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_psbt.cpp"
                 ,0x2f);
    local_58.filename = local_58.filename + 1;
    local_58.line = 0x70f;
    local_58.funcname = "Psbt";
    logger::warn<int&>(&local_58,"wally_psbt_is_elements NG[{}]",&local_3c);
    local_7a = 1;
    message = (string *)__cxa_allocate_exception(0x30);
    paVar3 = &local_79;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_78,"psbt elements check error.",paVar3);
    CfdException::CfdException
              ((CfdException *)CONCAT44(iVar1,in_stack_fffffffffffffee0),
               (CfdError)((ulong)paVar3 >> 0x20),message);
    local_7a = 0;
    __cxa_throw(message,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if (sStack_38 != 0) {
    wally_psbt_free(local_20);
    local_98.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_psbt.cpp"
                 ,0x2f);
    local_98.filename = local_98.filename + 1;
    local_98.line = 0x714;
    local_98.funcname = "Psbt";
    logger::warn<>(&local_98,"psbt elements format.");
    local_ba = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_b8,"psbt bitcoin tx format error.",&local_b9);
    CfdException::CfdException
              ((CfdException *)CONCAT44(iVar1,in_stack_fffffffffffffee0),error_code,
               in_stack_fffffffffffffed0);
    local_ba = 0;
    __cxa_throw(uVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  this->wally_psbt_pointer_ = local_20;
  RebuildTransaction(&local_100,this->wally_psbt_pointer_);
  Transaction::operator=(&this->base_tx_,&local_100);
  Transaction::~Transaction(in_stack_fffffffffffffec0);
  return;
}

Assistant:

Psbt::Psbt(const ByteData &byte_data) {
  struct wally_psbt *psbt_pointer = ParsePsbtData(byte_data);
  size_t is_elements = 0;
  int ret = wally_psbt_is_elements(psbt_pointer, &is_elements);
  if (ret != WALLY_OK) {
    wally_psbt_free(psbt_pointer);
    warn(CFD_LOG_SOURCE, "wally_psbt_is_elements NG[{}]", ret);
    throw CfdException(kCfdInternalError, "psbt elements check error.");
  }
  if (is_elements != 0) {
    wally_psbt_free(psbt_pointer);
    warn(CFD_LOG_SOURCE, "psbt elements format.");
    throw CfdException(kCfdInternalError, "psbt bitcoin tx format error.");
  }
  wally_psbt_pointer_ = psbt_pointer;
  base_tx_ = RebuildTransaction(wally_psbt_pointer_);
}